

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap2Local.cpp
# Opt level: O0

bool __thiscall wasm::anon_unknown_22::Heap2Local::canHandleAsLocals(Heap2Local *this,Type type)

{
  bool bVar1;
  Struct *this_00;
  reference pFVar2;
  Field local_70;
  undefined1 local_60 [8];
  Field field;
  const_iterator __end3;
  const_iterator __begin3;
  FieldList *__range3;
  FieldList *fields;
  HeapType heapType;
  Heap2Local *this_local;
  Type type_local;
  
  heapType.id._4_4_ = 1;
  this_local = (Heap2Local *)type.id;
  bVar1 = wasm::Type::operator==((Type *)&this_local,(BasicType *)((long)&heapType.id + 4));
  if (bVar1) {
    type_local.id._7_1_ = false;
  }
  else {
    fields = (FieldList *)wasm::Type::getHeapType((Type *)&this_local);
    bVar1 = HeapType::isStruct((HeapType *)&fields);
    if (bVar1) {
      this_00 = HeapType::getStruct((HeapType *)&fields);
      __end3 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::begin(&this_00->fields);
      field._8_8_ = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::end(&this_00->fields);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_wasm::Field_*,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>
                                         *)&field.packedType), bVar1) {
        pFVar2 = __gnu_cxx::
                 __normal_iterator<const_wasm::Field_*,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>
                 ::operator*(&__end3);
        local_60 = (undefined1  [8])(pFVar2->type).id;
        field.type.id._0_4_ = pFVar2->packedType;
        field.type.id._4_4_ = pFVar2->mutable_;
        bVar1 = canHandleAsLocal(this,(Field *)local_60);
        if (!bVar1) {
          return false;
        }
        __gnu_cxx::
        __normal_iterator<const_wasm::Field_*,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>
        ::operator++(&__end3);
      }
      type_local.id._7_1_ = true;
    }
    else {
      bVar1 = HeapType::isArray((HeapType *)&fields);
      if (!bVar1) {
        __assert_fail("heapType.isArray()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Heap2Local.cpp"
                      ,0x581,"bool wasm::(anonymous namespace)::Heap2Local::canHandleAsLocals(Type)"
                     );
      }
      HeapType::getArray((HeapType *)&local_70);
      type_local.id._7_1_ = canHandleAsLocal(this,&local_70);
    }
  }
  return type_local.id._7_1_;
}

Assistant:

bool canHandleAsLocals(Type type) {
    if (type == Type::unreachable) {
      return false;
    }

    auto heapType = type.getHeapType();
    if (heapType.isStruct()) {
      auto& fields = heapType.getStruct().fields;
      for (auto field : fields) {
        if (!canHandleAsLocal(field)) {
          return false;
        }
      }
      return true;
    }

    assert(heapType.isArray());
    return canHandleAsLocal(heapType.getArray().element);
  }